

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

StatisticObject Clasp::StatisticObject::fromRep(uint64 x)

{
  I *pIVar1;
  void *pvVar2;
  StatisticObject local_10;
  
  if (x == 0) {
    return (StatisticObject)0;
  }
  local_10.handle_ = x;
  pIVar1 = tid(&local_10);
  if ((pIVar1 != (I *)0x0) && (pvVar2 = self(&local_10), ((ulong)pvVar2 & 3) == 0)) {
    return (StatisticObject)x;
  }
  Potassco::fail(-2,"static StatisticObject Clasp::StatisticObject::fromRep(uint64)",99,
                 "r.tid() != 0 && (reinterpret_cast<uintp>(r.self()) & 3u) == 0","invalid key",0);
}

Assistant:

StatisticObject StatisticObject::fromRep(uint64 x) {
	if (!x) { return StatisticObject(0, 0); }
	StatisticObject r;
	r.handle_ = x;
	POTASSCO_REQUIRE(r.tid() != 0 && (reinterpret_cast<uintp>(r.self()) & 3u) == 0, "invalid key");
	return r;
}